

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_node.cpp
# Opt level: O2

BaseNode<(unsigned_char)__x04_,_(duckdb::NType)3> *
duckdb::BaseNode<(unsigned_char)'\x04',_(duckdb::NType)3>::DeleteChildInternal
          (ART *art,Node *node,uint8_t byte)

{
  byte bVar1;
  BaseNode<(unsigned_char)__x04_,_(duckdb::NType)3> *pBVar2;
  ulong uVar3;
  ulong uVar4;
  
  pBVar2 = Node::Ref<duckdb::BaseNode<(unsigned_char)4,(duckdb::NType)3>>
                     (art,(Node)(node->super_IndexPointer).data,NODE_4);
  for (uVar3 = 0;
      (uVar4 = (ulong)pBVar2->count, pBVar2->count != uVar3 &&
      (uVar4 = uVar3, pBVar2->key[uVar3] != byte)); uVar3 = uVar3 + 1) {
  }
  Node::Free(art,pBVar2->children + uVar4);
  bVar1 = pBVar2->count - 1;
  pBVar2->count = bVar1;
  for (; uVar4 < bVar1; uVar4 = uVar4 + 1) {
    pBVar2->key[uVar4] = pBVar2->key[uVar4 + 1];
    pBVar2->children[uVar4].super_IndexPointer.data =
         pBVar2->children[uVar4 + 1].super_IndexPointer.data;
  }
  return pBVar2;
}

Assistant:

BaseNode<CAPACITY, TYPE> &BaseNode<CAPACITY, TYPE>::DeleteChildInternal(ART &art, Node &node, const uint8_t byte) {
	auto &n = Node::Ref<BaseNode>(art, node, TYPE);

	uint8_t child_pos = 0;
	for (; child_pos < n.count; child_pos++) {
		if (n.key[child_pos] == byte) {
			break;
		}
	}

	// Free the child and decrease the count.
	Node::Free(art, n.children[child_pos]);
	n.count--;

	// Possibly move children backwards.
	for (uint8_t i = child_pos; i < n.count; i++) {
		n.key[i] = n.key[i + 1];
		n.children[i] = n.children[i + 1];
	}
	return n;
}